

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_finite_automaton.cpp
# Opt level: O0

void Omega_h::add_transition(FiniteAutomaton *fa,int from_state,int at_symbol,int to_state)

{
  int iVar1;
  Ref pvVar2;
  int to_state_local;
  int at_symbol_local;
  int from_state_local;
  FiniteAutomaton *fa_local;
  
  if (to_state < 0) {
    fail("assertion %s failed at %s +%d\n","0 <= to_state",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_finite_automaton.cpp"
         ,0x34);
  }
  iVar1 = get_nstates(fa);
  if (iVar1 <= to_state) {
    fail("assertion %s failed at %s +%d\n","to_state < get_nstates(fa)",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_finite_automaton.cpp"
         ,0x35);
  }
  if (at_symbol < 0) {
    fail("assertion %s failed at %s +%d\n","0 <= at_symbol",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_finite_automaton.cpp"
         ,0x36);
  }
  iVar1 = get_ncols<int>(&fa->table);
  if (at_symbol < iVar1) {
    pvVar2 = at<int>(&fa->table,from_state,at_symbol);
    if (*pvVar2 == -1) {
      pvVar2 = at<int>(&fa->table,from_state,at_symbol);
      *pvVar2 = to_state;
      return;
    }
    fail("assertion %s failed at %s +%d\n","at(fa.table, from_state, at_symbol) == -1",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_finite_automaton.cpp"
         ,0x39);
  }
  fail("assertion %s failed at %s +%d\n","at_symbol < get_ncols(fa.table)",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_finite_automaton.cpp"
       ,0x38);
}

Assistant:

void add_transition(
    FiniteAutomaton& fa, int from_state, int at_symbol, int to_state) {
  OMEGA_H_CHECK(0 <= to_state);
  OMEGA_H_CHECK(to_state < get_nstates(fa));
  OMEGA_H_CHECK(0 <= at_symbol);
  OMEGA_H_CHECK(
      at_symbol < get_ncols(fa.table));  // allow setting epsilon transitions
  OMEGA_H_CHECK(at(fa.table, from_state, at_symbol) == -1);
  at(fa.table, from_state, at_symbol) = to_state;
}